

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O1

void msd_lsd<4u>(Cacheblock<4U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  int iVar2;
  size_t i;
  uchar *puVar3;
  void *__src;
  long lVar4;
  Cacheblock<4U> *pCVar5;
  ulong uVar6;
  long lVar7;
  uchar *puVar8;
  ulong uVar9;
  size_t N_00;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  Cacheblock<4U> *pCVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  long local_1038 [256];
  long local_838 [257];
  
  lVar14 = depth + 1;
  while (0x1f < N) {
    fill_cache<4u>(cache,N,depth);
    puVar8 = (cache->chars)._M_elems + 3;
    lVar15 = 3;
    do {
      memset(local_1038 + 0x100,0,0x800);
      puVar3 = puVar8;
      uVar6 = N;
      do {
        local_1038[(ulong)*puVar3 + 0x100] = local_1038[(ulong)*puVar3 + 0x100] + 1;
        puVar3 = puVar3 + 0x10;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      __src = malloc(N << 4);
      local_1038[0] = 0;
      lVar4 = 1;
      lVar7 = 0;
      do {
        lVar7 = lVar7 + local_1038[lVar4 + 0xff];
        local_1038[lVar4] = lVar7;
        lVar4 = lVar4 + 1;
        pCVar5 = cache;
        uVar6 = N;
      } while (lVar4 != 0x100);
      do {
        bVar10 = (pCVar5->chars)._M_elems[lVar15];
        lVar4 = local_1038[bVar10];
        local_1038[bVar10] = lVar4 + 1;
        puVar3 = pCVar5->ptr;
        puVar1 = (undefined8 *)((long)__src + lVar4 * 0x10);
        *puVar1 = *(undefined8 *)pCVar5;
        puVar1[1] = puVar3;
        uVar6 = uVar6 - 1;
        pCVar5 = pCVar5 + 1;
      } while (uVar6 != 0);
      memcpy(cache,__src,N << 4);
      free(__src);
      puVar8 = puVar8 + -1;
      bVar17 = lVar15 != 0;
      lVar15 = lVar15 + -1;
    } while (bVar17);
    if (N == 1) {
      uVar9 = 1;
      uVar6 = 0;
    }
    else {
      uVar16 = 1;
      pCVar5 = cache;
      N_00 = 1;
      uVar11 = 0;
      do {
        if (*(int *)(pCVar5->chars)._M_elems == *(int *)pCVar5[1].chars._M_elems) {
          uVar9 = N_00 + 1;
          uVar6 = uVar11;
        }
        else {
          uVar9 = 1;
          uVar6 = uVar16;
          if ((1 < N_00) && (cache[uVar11].chars._M_elems[3] != '\0')) {
            msd_lsd<4u>(cache + uVar11,N_00,depth + 4);
          }
        }
        uVar16 = uVar16 + 1;
        pCVar5 = pCVar5 + 1;
        N_00 = uVar9;
        uVar11 = uVar6;
      } while (N != uVar16);
    }
    if (uVar9 < 2) {
      return;
    }
    if (cache[uVar6].chars._M_elems[3] == '\0') {
      return;
    }
    cache = cache + uVar6;
    depth = depth + 4;
    lVar14 = lVar14 + 4;
    N = uVar9;
  }
  pCVar5 = cache;
  if (1 < (long)N) {
    do {
      puVar8 = pCVar5[1].ptr;
      for (pCVar13 = pCVar5 + 1; cache < pCVar13; pCVar13 = pCVar13 + -1) {
        puVar3 = pCVar13[-1].ptr;
        bVar10 = puVar3[depth];
        bVar12 = puVar8[depth];
        if ((bVar10 != 0) && (lVar15 = lVar14, bVar10 == bVar12)) {
          do {
            bVar10 = puVar3[lVar15];
            bVar12 = puVar8[lVar15];
            if (bVar10 == 0) break;
            lVar15 = lVar15 + 1;
          } while (bVar10 == bVar12);
        }
        if (bVar10 <= bVar12) break;
        pCVar13->ptr = puVar3;
      }
      iVar2 = (int)N;
      pCVar13->ptr = puVar8;
      N = (size_t)(iVar2 - 1);
      pCVar5 = pCVar5 + 1;
    } while (2 < iVar2);
  }
  return;
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}